

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O0

Boxed_Value * __thiscall
chaiscript::dispatch::Dynamic_Object::get_attr(Dynamic_Object *this,string *t_attr_name)

{
  bool bVar1;
  pointer ppVar2;
  range_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Self local_28;
  _Self local_20;
  const_iterator a;
  string *t_attr_name_local;
  Dynamic_Object *this_local;
  
  a._M_node = (_Base_ptr)t_attr_name;
  local_20._M_node =
       (_Base_ptr)
       Catch::clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::find(&this->m_attrs,t_attr_name);
  local_28._M_node =
       (_Base_ptr)
       Catch::clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       ::end(&this->m_attrs);
  bVar1 = Catch::clara::std::operator==(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_68,"Attr not found \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a._M_node);
    std::operator+(&local_48,&local_68,"\' and cannot be added to const obj");
    std::range_error::range_error(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  ppVar2 = Catch::clara::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
           ::operator->(&local_20);
  return &ppVar2->second;
}

Assistant:

const Boxed_Value &get_attr(const std::string &t_attr_name) const {
        auto a = m_attrs.find(t_attr_name);

        if (a != m_attrs.end()) {
          return a->second;
        } else {
          throw std::range_error("Attr not found '" + t_attr_name + "' and cannot be added to const obj");
        }
      }